

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

bool anon_unknown.dwarf_572801::EnvironmentHelper
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  String SStack_38;
  
  if ((value == (Value *)0x0) || (bVar1 = Json::Value::isNull(value), bVar1)) {
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)out);
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (!bVar1) {
      cmCMakePresetsErrors::INVALID_PRESET(value,state);
      return false;
    }
    Json::Value::asString_abi_cxx11_(&SStack_38,value);
    std::optional<std::__cxx11::string>::operator=((optional<std::__cxx11::string> *)out,&SStack_38)
    ;
    std::__cxx11::string::~string((string *)&SStack_38);
  }
  return true;
}

Assistant:

bool EnvironmentHelper(cm::optional<std::string>& out,
                       const Json::Value* value, cmJSONState* state)
{
  if (!value || value->isNull()) {
    out = cm::nullopt;
    return true;
  }
  if (value->isString()) {
    out = value->asString();
    return true;
  }
  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}